

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_SetColor(FParser *this)

{
  bool bVar1;
  int tagnum;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FDynamicColormap *pFVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  FSSectorTagIterator itr;
  
  bVar1 = CheckArgs(this,2);
  if (bVar1) {
    tagnum = intvalue(this->t_argv);
    iVar2 = T_FindFirstSectorFromTag(tagnum);
    if (-1 < iVar2) {
      if ((this->t_argc & 0xfffffffeU) == 2) {
        uVar3 = intvalue(this->t_argv + 1);
        uVar6 = uVar3 >> 8;
        uVar8 = uVar3 >> 0x10;
        uVar7 = uVar3 & 0xff000000;
      }
      else {
        if (this->t_argc < 4) {
          return;
        }
        uVar8 = intvalue(this->t_argv + 1);
        uVar6 = intvalue(this->t_argv + 2);
        uVar3 = intvalue(this->t_argv + 3);
        uVar7 = 0;
      }
      FSSectorTagIterator::FSSectorTagIterator(&itr,tagnum);
      while (uVar4 = FSectorTagIterator::Next(&itr.super_FSectorTagIterator), -1 < (int)uVar4) {
        pFVar5 = GetSpecialLights((PalEntry)
                                  (uVar3 & 0xff | (uVar6 & 0xff) << 8 |
                                  (uVar8 & 0xff) << 0x10 | uVar7),
                                  (PalEntry)((sectors[uVar4].ColorMap)->Fade).field_0.field_0,0);
        sectors[uVar4].ColorMap = pFVar5;
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_SetColor(void)
{
	int tagnum, secnum;
	int c=2;
	int i = -1;
	PalEntry color=0;
	
	if (CheckArgs(2))
	{
		tagnum = intvalue(t_argv[0]);
		
		secnum = T_FindFirstSectorFromTag(tagnum);
		
		if(secnum < 0)
		{ 
			return;
		}
		
		if(t_argc >1 && t_argc<4)
		{
			color=intvalue(t_argv[1]);
		}
		else if (t_argc>=4)
		{
			color.r=intvalue(t_argv[1]);
			color.g=intvalue(t_argv[2]);
			color.b=intvalue(t_argv[3]);
			color.a=0;
		}
		else return;

		// set all sectors with tag
		FSSectorTagIterator itr(tagnum);
		while ((i = itr.Next()) >= 0)
		{
			sectors[i].ColorMap = GetSpecialLights (color, sectors[i].ColorMap->Fade, 0);
		}
	}
}